

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::load_sequence_groups_files(HL1MDLLoader *this)

{
  int iVar1;
  long lVar2;
  char cVar3;
  uchar **ppuVar4;
  SequenceHeader_HL1 **ppSVar5;
  long *plVar6;
  undefined8 *puVar7;
  ostream *poVar8;
  long lVar9;
  ulong *puVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  string sequence_file_path;
  string file_path_without_extension;
  stringstream ss;
  string local_218;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  undefined8 auStack_198 [12];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  iVar1 = this->header_->numseqgroups;
  if ((long)iVar1 < 2) {
    return;
  }
  this->num_sequence_groups_ = iVar1;
  uVar12 = (long)iVar1 << 3;
  ppuVar4 = (uchar **)operator_new__(uVar12);
  this->anim_buffers_ = ppuVar4;
  ppSVar5 = (SequenceHeader_HL1 **)operator_new__(uVar12);
  this->anim_headers_ = ppSVar5;
  if (0 < this->num_sequence_groups_) {
    lVar9 = 0;
    do {
      this->anim_buffers_[lVar9] = (uchar *)0x0;
      this->anim_headers_[lVar9] = (SequenceHeader_HL1 *)0x0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->num_sequence_groups_);
  }
  DefaultIOSystem::absolutePath(&local_218,this->file_path_);
  (*this->io_->_vptr_IOSystem[3])();
  plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_218,local_218._M_string_length,0,'\x01');
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_1a8 = *puVar10;
    lStack_1a0 = plVar6[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar10;
    local_1b8 = (ulong *)*plVar6;
  }
  local_1b0 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DefaultIOSystem::completeBaseName(&local_1d8,this->file_path_);
  uVar12 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar12 = local_1a8;
  }
  if (uVar12 < local_1d8._M_string_length + local_1b0) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar11 = local_1d8.field_2._M_allocated_capacity;
    }
    if (local_1d8._M_string_length + local_1b0 <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1b8);
      goto LAB_0048d361;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_1d8._M_dataplus._M_p);
LAB_0048d361:
  local_1f8 = &local_1e8;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_1e8 = *plVar6;
    uStack_1e0 = puVar7[3];
  }
  else {
    local_1e8 = *plVar6;
    local_1f8 = (long *)*puVar7;
  }
  local_1f0 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
      &local_218.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                    local_218.field_2._M_allocated_capacity + 1);
  }
  if (1 < this->num_sequence_groups_) {
    lVar9 = 1;
    lVar13 = 8;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,(char *)local_1f8,local_1f0);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8 - 0x18)) = 2;
      lVar2 = *(long *)(local_1a8 - 0x18);
      if (acStack_c8[lVar2 + 1] == '\0') {
        cVar3 = std::ios::widen((char)(ostream *)&local_1a8 + (char)lVar2);
        acStack_c8[lVar2] = cVar3;
        acStack_c8[lVar2 + 1] = '\x01';
      }
      acStack_c8[lVar2] = '0';
      std::ostream::operator<<((ostream *)&local_1a8,(int)lVar9);
      local_218._M_dataplus._M_p._0_1_ = 0x2e;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1a8,(char *)&local_218,1);
      BaseImporter::GetExtension(&local_218,this->file_path_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,
                                         local_218._M_dataplus._M_p._0_1_),
                 local_218._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
          &local_218.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                        local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
                (this,&local_218,(uchar **)((long)this->anim_buffers_ + lVar13));
      this->anim_headers_[lVar9] = (SequenceHeader_HL1 *)this->anim_buffers_[lVar9];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
          &local_218.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                        local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar9 < this->num_sequence_groups_);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  return;
}

Assistant:

void HL1MDLLoader::load_sequence_groups_files() {
    if (header_->numseqgroups <= 1)
        return;

    num_sequence_groups_ = header_->numseqgroups;

    anim_buffers_ = new unsigned char *[num_sequence_groups_];
    anim_headers_ = new SequenceHeader_HL1 *[num_sequence_groups_];
    for (int i = 0; i < num_sequence_groups_; ++i) {
        anim_buffers_[i] = NULL;
        anim_headers_[i] = NULL;
    }

    std::string file_path_without_extension =
            DefaultIOSystem::absolutePath(file_path_) +
            io_->getOsSeparator() +
            DefaultIOSystem::completeBaseName(file_path_);

    for (int i = 1; i < num_sequence_groups_; ++i) {
        std::stringstream ss;
        ss << file_path_without_extension;
        ss << std::setw(2) << std::setfill('0') << i;
        ss << '.' << BaseImporter::GetExtension(file_path_);

        std::string sequence_file_path = ss.str();

        load_file_into_buffer<SequenceHeader_HL1>(sequence_file_path, anim_buffers_[i]);

        anim_headers_[i] = (SequenceHeader_HL1 *)anim_buffers_[i];
    }
}